

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall
cfgfile::exception_t<cfgfile::string_trait_t>::exception_t
          (exception_t<cfgfile::string_trait_t> *this,string_t *what)

{
  string *in_RSI;
  logic_error *in_RDI;
  
  std::logic_error::logic_error(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__exception_t_00171c68;
  std::__cxx11::string::string((string *)(in_RDI + 0x10),in_RSI);
  return;
}

Assistant:

explicit exception_t( string_trait_t::string_t what )
		:	std::logic_error( what )
		,	m_what( std::move( what ) )
	{
	}